

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O0

string * __thiscall
toml::concat_to_string<char_const(&)[33],toml::value_t>
          (string *__return_storage_ptr__,toml *this,char (*args) [33],value_t *args_1)

{
  ostream *this_00;
  value_t *in_R8;
  ostringstream local_198 [8];
  ostringstream oss;
  value_t *args_local_1;
  char (*args_local) [33];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  this_00 = (ostream *)std::ostream::operator<<((ostream *)local_198,std::boolalpha);
  std::ostream::operator<<(this_00,std::fixed);
  detail::concat_to_string_impl<char_const(&)[33],toml::value_t>
            (__return_storage_ptr__,(detail *)local_198,(ostringstream *)this,args,in_R8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string concat_to_string(Ts&& ... args)
{
    std::ostringstream oss;
    oss << std::boolalpha << std::fixed;
    return detail::concat_to_string_impl(oss, std::forward<Ts>(args) ...);
}